

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O3

void duckdb::AggregateStateCombine(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  ArenaAllocator *this;
  PhysicalType PVar1;
  uint uVar2;
  undefined8 uVar3;
  BoundFunctionExpression *pBVar4;
  pointer pFVar5;
  reference pvVar6;
  idx_t iVar7;
  IOException *pIVar8;
  idx_t iVar9;
  unsigned_long *len;
  data_ptr_t pdVar10;
  uint *puVar11;
  Vector *pVVar12;
  ulong uVar13;
  idx_t idx;
  uint *puVar14;
  anon_union_16_2_67f50693_for_value aVar15;
  string_t sVar16;
  AggregateInputData aggr_input_data;
  UnifiedVectorFormat state0_data;
  UnifiedVectorFormat state1_data;
  string local_120;
  undefined1 local_100 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  UnifiedVectorFormat local_b8;
  string local_70;
  string local_50;
  
  pBVar4 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&state_p->expr->super_BaseExpression);
  pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar4->bind_info);
  local_100._0_8_ = state_p[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)local_100);
  uVar3 = local_100._0_8_;
  this = (ArenaAllocator *)(local_100._0_8_ + 0xf0);
  ArenaAllocator::Reset(this);
  pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  PVar1 = (pvVar6->type).physical_type_;
  pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  if (PVar1 != (pvVar6->type).physical_type_) {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x10);
    local_100._0_8_ = local_100 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Aggregate state combine type mismatch, expect %s, got %s","");
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    LogicalType::ToString_abi_cxx11_(&local_50,&pvVar6->type);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
    LogicalType::ToString_abi_cxx11_(&local_70,&pvVar6->type);
    IOException::IOException<std::__cxx11::string,std::__cxx11::string>
              (pIVar8,(string *)local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    __cxa_throw(pIVar8,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  Vector::ToUnifiedFormat(pvVar6,input->count,(UnifiedVectorFormat *)local_100);
  pvVar6 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  Vector::ToUnifiedFormat(pvVar6,input->count,&local_b8);
  if (input->count != 0) {
    pdVar10 = result->data + 8;
    idx = 0;
    do {
      iVar9 = idx;
      if (*(_func_int ***)local_100._0_8_ != (_func_int **)0x0) {
        iVar9 = (idx_t)*(uint *)((long)*(_func_int ***)local_100._0_8_ + idx * 4);
      }
      iVar7 = idx;
      if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)(local_b8.sel)->sel_vector[idx];
      }
      puVar11 = (uint *)(local_100._8_8_ + iVar9 * 0x10);
      puVar14 = (uint *)(local_b8.data + iVar7 * 0x10);
      if (((unsigned_long *)local_100._16_8_ == (unsigned_long *)0x0) ||
         (uVar13 = 1L << ((byte)iVar9 & 0x3f),
         (*(ulong *)(local_100._16_8_ + (iVar9 >> 6) * 8) >> (iVar9 & 0x3f) & 1) != 0)) {
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) != 0)) {
          if ((unsigned_long *)local_100._16_8_ != (unsigned_long *)0x0) {
            uVar13 = 1L << ((byte)iVar9 & 0x3f);
            goto LAB_01119da3;
          }
LAB_01119dad:
          uVar2 = *puVar11;
          if ((pFVar5[0x27]._vptr_FunctionData != (_func_int **)(ulong)uVar2) || (uVar2 != *puVar14)
             ) {
            pIVar8 = (IOException *)__cxa_allocate_exception(0x10);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,
                       "Aggregate state size mismatch, expect %llu, got %llu and %llu","");
            IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                      (pIVar8,&local_120,(unsigned_long)pFVar5[0x27]._vptr_FunctionData,
                       (ulong)*puVar11,(ulong)*puVar14);
            __cxa_throw(pIVar8,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (uVar2 < 0xd) {
            puVar11 = puVar11 + 1;
          }
          else {
            puVar11 = *(uint **)(puVar11 + 2);
          }
          switchD_012bc561::default
                    (((FunctionLocalState *)(uVar3 + 0x10))->_vptr_FunctionLocalState,puVar11,
                     (size_t)(ulong)uVar2);
          if (*puVar14 < 0xd) {
            puVar14 = puVar14 + 1;
          }
          else {
            puVar14 = *(uint **)(puVar14 + 2);
          }
          switchD_012bc561::default
                    (((FunctionLocalState *)(uVar3 + 0x18))->_vptr_FunctionLocalState,puVar14,
                     (size_t)pFVar5[0x27]._vptr_FunctionData);
          local_120._M_dataplus._M_p = (pointer)0x0;
          local_120.field_2._M_local_buf[0] = '\x02';
          iVar9 = 1;
          local_120._M_string_length = (size_type)this;
          (*(code *)pFVar5[0x1a]._vptr_FunctionData)
                    ((FunctionLocalState *)(uVar3 + 0x20),(FunctionLocalState *)(uVar3 + 0x88),
                     &local_120);
          aVar15.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddStringOrBlob
                         ((StringVector *)result,
                          (Vector *)((FunctionLocalState *)(uVar3 + 0x18))->_vptr_FunctionLocalState
                          ,(char *)pFVar5[0x27]._vptr_FunctionData,iVar9);
        }
        else {
          if (*puVar11 < 0xd) {
            pVVar12 = (Vector *)(puVar11 + 1);
          }
          else {
            pVVar12 = *(Vector **)(puVar11 + 2);
          }
          aVar15.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddStringOrBlob
                         ((StringVector *)result,pVVar12,(char *)pFVar5[0x27]._vptr_FunctionData,
                          iVar9);
        }
        *(long *)(pdVar10 + -8) = aVar15._0_8_;
        *(char **)pdVar10 = aVar15.pointer.ptr;
      }
      else if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) ||
              ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
LAB_01119da3:
        if (((*(ulong *)(local_100._16_8_ + (iVar9 >> 6) * 8) & uVar13) != 0) ||
           ((len = local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
            local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0 &&
            (len = (unsigned_long *)
                   local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [iVar7 >> 6], ((ulong)len >> (iVar7 & 0x3f) & 1) == 0)))) goto LAB_01119dad;
        if (*puVar14 < 0xd) {
          pVVar12 = (Vector *)(puVar14 + 1);
        }
        else {
          pVVar12 = *(Vector **)(puVar14 + 2);
        }
        sVar16 = StringVector::AddStringOrBlob
                           ((StringVector *)result,pVVar12,(char *)pFVar5[0x27]._vptr_FunctionData,
                            (idx_t)len);
        *(long *)(pdVar10 + -8) = sVar16.value._0_8_;
        *(long *)pdVar10 = sVar16.value._8_8_;
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
      pdVar10 = pdVar10 + 0x10;
    } while (idx < input->count);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  return;
}

Assistant:

static void AggregateStateCombine(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<CombineState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));

	D_ASSERT(input.data.size() == 2);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	D_ASSERT(input.data[0].GetType() == result.GetType());

	if (input.data[0].GetType().InternalType() != input.data[1].GetType().InternalType()) {
		throw IOException("Aggregate state combine type mismatch, expect %s, got %s",
		                  input.data[0].GetType().ToString(), input.data[1].GetType().ToString());
	}

	UnifiedVectorFormat state0_data, state1_data;
	input.data[0].ToUnifiedFormat(input.size(), state0_data);
	input.data[1].ToUnifiedFormat(input.size(), state1_data);

	auto result_ptr = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state0_idx = state0_data.sel->get_index(i);
		auto state1_idx = state1_data.sel->get_index(i);

		auto &state0 = UnifiedVectorFormat::GetData<string_t>(state0_data)[state0_idx];
		auto &state1 = UnifiedVectorFormat::GetData<string_t>(state1_data)[state1_idx];

		// if both are NULL, we return NULL. If either of them is not, the result is that one
		if (!state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		if (state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state0.GetData()), bind_data.state_size);
			continue;
		}
		if (!state0_data.validity.RowIsValid(state0_idx) && state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state1.GetData()), bind_data.state_size);
			continue;
		}

		// we actually have to combine
		if (state0.GetSize() != bind_data.state_size || state1.GetSize() != bind_data.state_size) {
			throw IOException("Aggregate state size mismatch, expect %llu, got %llu and %llu", bind_data.state_size,
			                  state0.GetSize(), state1.GetSize());
		}

		memcpy(local_state.state_buffer0.get(), state0.GetData(), bind_data.state_size);
		memcpy(local_state.state_buffer1.get(), state1.GetData(), bind_data.state_size);

		AggregateInputData aggr_input_data(nullptr, local_state.allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
		bind_data.aggr.combine(local_state.state_vector0, local_state.state_vector1, aggr_input_data, 1);

		result_ptr[i] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(local_state.state_buffer1.get()),
		                                              bind_data.state_size);
	}
}